

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBuildPrograms.cpp
# Opt level: O0

void __thiscall vkt::anon_unknown_0::ValidateBinaryTask::execute(ValidateBinaryTask *this)

{
  bool bVar1;
  ProgramBinary *program;
  ostringstream local_188 [8];
  ostringstream validationLog;
  ValidateBinaryTask *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  program = de::SharedPtr<vk::ProgramBinary>::operator*(&this->m_program->binary);
  bVar1 = ::vk::validateProgram(program,(ostream *)local_188);
  if (bVar1) {
    this->m_program->validationStatus = STATUS_PASSED;
  }
  else {
    this->m_program->validationStatus = STATUS_FAILED;
  }
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void execute (void)
	{
		DE_ASSERT(m_program->buildStatus == Program::STATUS_PASSED);

		std::ostringstream validationLog;

		if (vk::validateProgram(*m_program->binary, &validationLog))
			m_program->validationStatus = Program::STATUS_PASSED;
		else
			m_program->validationStatus = Program::STATUS_FAILED;
	}